

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_in.c
# Opt level: O3

gdImagePtr gdImageCreateFromGifCtx(gdIOCtxPtr fd)

{
  ushort uVar1;
  ushort uVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  gdImagePtr im;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint color;
  uchar (*cmap) [256];
  uint uVar9;
  uchar c;
  uchar buf [16];
  int ZeroDataBlock;
  uchar localColorMap [3] [256];
  uchar ColorMap [3] [256];
  char local_661;
  uint local_660;
  uint local_65c;
  ushort local_658;
  char cStack_656;
  undefined1 uStack_655;
  byte bStack_654;
  char cStack_653;
  ushort local_652;
  uint local_650;
  uint local_644;
  uint local_640;
  int local_63c;
  uint local_638 [192];
  uchar local_338 [776];
  
  local_63c = 0;
  iVar5 = gdGetBuf(&local_658,6,fd);
  if ((((0 < iVar5) && (cStack_656 == 'F' && local_658 == 0x4947)) &&
      ((cStack_653 == 'a' && CONCAT11(bStack_654,uStack_655) == 0x3738 ||
       (cStack_653 == 'a' && CONCAT11(bStack_654,uStack_655) == 0x3938)))) &&
     (iVar5 = gdGetBuf(&local_658,7,fd), uVar2 = local_658, 0 < iVar5)) {
    uVar1 = CONCAT11(uStack_655,cStack_656);
    uVar9 = (uint)bStack_654;
    if (((-1 < (char)bStack_654) ||
        (iVar5 = ReadColorMap(fd,2 << (bStack_654 & 7),(uchar (*) [256])local_338), iVar5 == 0)) &&
       (iVar5 = gdGetBuf(&local_661,1,fd), 0 < iVar5)) {
      local_660 = (uint)uVar2;
      local_640 = (uint)uVar1;
      color = 0xffffffff;
      local_644 = uVar9;
      do {
        if (local_661 == '!') {
          iVar5 = gdGetBuf(&local_661,1,fd);
          if (iVar5 < 1) {
            return (gdImagePtr)0x0;
          }
          if (local_661 == -7) {
            local_638[0] = 0;
            local_65c = color;
            GetDataBlock(fd,(uchar *)local_638,&local_63c);
            uVar4 = local_638[0];
            uVar9 = local_638[0] >> 0x18;
            do {
              iVar5 = GetDataBlock(fd,(uchar *)local_638,&local_63c);
            } while (0 < iVar5);
            color = local_65c;
            if ((uVar4 & 1) != 0) {
              color = uVar9;
            }
          }
          else {
            do {
              iVar5 = GetDataBlock(fd,(uchar *)local_638,&local_63c);
            } while (0 < iVar5);
          }
        }
        else {
          if (local_661 == ',') {
            iVar5 = gdGetBuf(&local_658,9,fd);
            if (iVar5 < 1) {
              return (gdImagePtr)0x0;
            }
            bVar3 = (byte)local_650;
            bVar8 = (byte)local_650 & 7;
            local_65c = (uint)CONCAT11(cStack_653,bStack_654);
            if (local_660 < local_658 + local_65c) {
              return (gdImagePtr)0x0;
            }
            local_660 = (uint)local_652;
            if (local_640 < CONCAT11(uStack_655,cStack_656) + local_660) {
              return (gdImagePtr)0x0;
            }
            im = gdImageCreate((uint)CONCAT11(cStack_653,bStack_654),(uint)local_652);
            if (im == (gdImagePtr)0x0) {
              return (gdImagePtr)0x0;
            }
            uVar9 = local_650 >> 6 & 1;
            im->interlace = uVar9;
            if ((char)bVar3 < '\0') {
              iVar5 = ReadColorMap(fd,1 << bVar8 + 1,(uchar (*) [256])local_638);
              if (iVar5 != 0) goto LAB_001170fe;
              uVar9 = local_650 >> 6 & 1;
              cmap = (uchar (*) [256])local_638;
            }
            else {
              if (-1 < (char)local_644) goto LAB_001170fe;
              cmap = (uchar (*) [256])local_338;
            }
            ReadImage(im,fd,local_65c,local_660,cmap,uVar9,&local_63c);
            if (color != 0xffffffff) {
              gdImageColorTransparent(im,color);
            }
            uVar9 = im->colorsTotal;
            if ((ulong)uVar9 != 0) {
              if ((int)uVar9 < 1) {
                return im;
              }
              lVar6 = (ulong)uVar9 + 0x304;
              do {
                uVar9 = uVar9 - 1;
                if (im->red[lVar6 + -5] == 0) {
                  return im;
                }
                im->colorsTotal = uVar9;
                uVar7 = lVar6 - 0x304;
                lVar6 = lVar6 + -1;
              } while (1 < uVar7);
              return im;
            }
LAB_001170fe:
            gdImageDestroy(im);
            return (gdImagePtr)0x0;
          }
          if (local_661 == ';') {
            return (gdImagePtr)0x0;
          }
        }
        iVar5 = gdGetBuf(&local_661,1,fd);
        if (iVar5 < 1) {
          return (gdImagePtr)0x0;
        }
      } while( true );
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGifCtx(gdIOCtxPtr fd)
{
	int BitPixel;
#if 0
	int ColorResolution;
	int Background;
	int AspectRatio;
#endif
	int Transparent = (-1);
	unsigned char buf[16];
	unsigned char c;
	unsigned char ColorMap[3][MAXCOLORMAPSIZE];
	unsigned char localColorMap[3][MAXCOLORMAPSIZE];
	int imw, imh, screen_width, screen_height;
	int useGlobalColormap;
	int bitPixel, i;
	/*1.4//int             imageCount = 0; */
	/* 2.0.28: threadsafe storage */
	int ZeroDataBlock = FALSE;
	int haveGlobalColormap;

	gdImagePtr im = 0;

	if(!ReadOK(fd, buf, 6)) {
		return 0;
	}

	if(strncmp((char *)buf, "GIF", 3) != 0) {
		return 0;
	}

	if(memcmp((char *)buf + 3, "87a", 3) == 0) {
		/* GIF87a */
	} else if(memcmp((char *)buf + 3, "89a", 3) == 0) {
		/* GIF89a */
	} else {
		return 0;
	}

	if(!ReadOK(fd, buf, 7)) {
		return 0;
	}

	BitPixel = 2 << (buf[4] & 0x07);
#if 0
	ColorResolution = (int) (((buf[4]&0x70)>>3)+1);
	Background = buf[5];
	AspectRatio = buf[6];
#endif
	screen_width = imw = LM_to_uint(buf[0], buf[1]);
	screen_height = imh = LM_to_uint(buf[2], buf[3]);

	haveGlobalColormap = BitSet(buf[4], LOCALCOLORMAP); /* Global Colormap */
	if(haveGlobalColormap) {
		if(ReadColorMap(fd, BitPixel, ColorMap)) {
			return 0;
		}
	}

	for (;;) {
		int top, left;
		int width, height;

		if(!ReadOK(fd, &c, 1)) {
			return 0;
		}

		if (c == ';') { /* GIF terminator */
			goto terminated;
		}

		if(c == '!') { /* Extension */
			if(!ReadOK(fd, &c, 1)) {
				return 0;
			}

			DoExtension(fd, c, &Transparent, &ZeroDataBlock);
			continue;
		}

		if(c != ',') { /* Not a valid start character */
			continue;
		}

		/*1.4//++imageCount; */

		if(!ReadOK(fd, buf, 9)) {
			return 0;
		}

		useGlobalColormap = !BitSet(buf[8], LOCALCOLORMAP);

		bitPixel = 1 << ((buf[8] & 0x07) + 1);
		left = LM_to_uint(buf[0], buf[1]);
		top = LM_to_uint(buf[2], buf[3]);
		width = LM_to_uint(buf[4], buf[5]);
		height = LM_to_uint(buf[6], buf[7]);

		if(((left + width) > screen_width) || ((top + height) > screen_height)) {
			if(VERBOSE) {
				printf("Frame is not confined to screen dimension.\n");
			}
			return 0;
		}

		if(!(im = gdImageCreate(width, height))) {
			return 0;
		}

		im->interlace = BitSet(buf[8], INTERLACE);
		if(!useGlobalColormap) {
			if(ReadColorMap(fd, bitPixel, localColorMap)) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, localColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		} else {
			if(!haveGlobalColormap) {
				gdImageDestroy(im);
				return 0;
			}

			ReadImage(im, fd, width, height, ColorMap, BitSet(buf[8], INTERLACE), &ZeroDataBlock);
		}

		if(Transparent != (-1)) {
			gdImageColorTransparent(im, Transparent);
		}

		goto terminated;
	}

terminated:
	/* Terminator before any image was declared! */
	if(!im) {
		return 0;
	}

	if(!im->colorsTotal) {
		gdImageDestroy(im);
		return 0;
	}

	/* Check for open colors at the end, so
	 * we can reduce colorsTotal and ultimately
	 * BitsPerPixel */
	for(i = im->colorsTotal - 1; i >= 0; i--) {
		if(im->open[i]) {
			im->colorsTotal--;
		} else {
			break;
		}
	}

	return im;
}